

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O2

void __thiscall wabt::anon_unknown_0::CWriter::Write(CWriter *this,ExternalInstanceRef *name)

{
  size_type sVar1;
  GlobalName *u;
  GlobalName local_28;
  
  sVar1 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count(&this->import_syms_,(name->super_GlobalName).name);
  if (sVar1 == 0) {
    local_28.type = (name->super_GlobalName).type;
    local_28._4_4_ = *(undefined4 *)&(name->super_GlobalName).field_0x4;
    local_28.name = (name->super_GlobalName).name;
    (anonymous_namespace)::CWriter::Write<char_const(&)[11],wabt::(anonymous_namespace)::GlobalName>
              ((CWriter *)this,(char (*) [11])&local_28,u);
  }
  else {
    local_28.type = (name->super_GlobalName).type;
    local_28._4_4_ = *(undefined4 *)&(name->super_GlobalName).field_0x4;
    local_28.name = (name->super_GlobalName).name;
    WriteData(this,"(*instance->",0xc);
    Write(this,&local_28);
    WriteData(this,")",1);
  }
  return;
}

Assistant:

void CWriter::Write(const ExternalInstanceRef& name) {
  bool is_import = import_syms_.count(name.name) != 0;
  if (is_import) {
    Write("(*instance->", GlobalName(name), ")");
  } else {
    Write("instance->", GlobalName(name));
  }
}